

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_ea_a(m68k_info *info,int opcode,uint8_t size)

{
  cs_m68k *op;
  undefined1 in_DL;
  undefined4 in_ESI;
  long in_RDI;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffe0;
  cs_m68k_op *pcVar1;
  undefined8 in_stack_ffffffffffffffe8;
  undefined3 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  
  uVar2 = CONCAT13(in_DL,in_stack_fffffffffffffff0);
  op = build_init_op((m68k_info *)CONCAT44(in_ESI,uVar2),
                     (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(int)in_stack_ffffffffffffffe8,
                     (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  pcVar1 = op->operands + 1;
  get_ea_mode_op((m68k_info *)CONCAT44(in_ESI,uVar2),op->operands,(uint)((ulong)pcVar1 >> 0x20),
                 (uint)pcVar1);
  pcVar1->address_mode = M68K_AM_REG_DIRECT_ADDR;
  (pcVar1->field_0).reg = (*(uint *)(in_RDI + 0x24) >> 9 & 7) + M68K_REG_A0;
  return;
}

Assistant:

static void build_ea_a(m68k_info *info, int opcode, uint8_t size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, size);

	op1->address_mode = M68K_AM_REG_DIRECT_ADDR;
	op1->reg = M68K_REG_A0 + ((info->ir >> 9) & 7);
}